

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lzma.c
# Opt level: O3

void test_option_lzma(void)

{
  wchar_t wVar1;
  size_t in_RAX;
  char *pcVar2;
  size_t s;
  
  s = in_RAX;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                      ,L'$',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -cf - --lzma f >archive.out 2>archive.err",testprog);
  pcVar2 = slurpfile(&s,"archive.err");
  pcVar2[s] = '\0';
  if (wVar1 == L'\0') {
    pcVar2 = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                     ,L'7',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                        ,L'8',pcVar2,"p","]","\"\\x5d\\00\\00\"",3,"3",(void *)0x0);
  }
  else {
    pcVar2 = strstr(pcVar2,"Unsupported compression");
    if (pcVar2 == (char *)0x0) {
      failure("--lzma option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                          ,L'2',(long)wVar1,"r",0,"0",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                     ,L'-');
      test_skipping("This version of bsdtar was compiled without lzma support");
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_lzma)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lzma compression. */
	r = systemf("%s -cf - --lzma f >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdtar was compiled "
			    "without lzma support");
			return;
		}
		failure("--lzma option is broken");
		assertEqualInt(r, 0);
		return;
	}
	/* Check that the archive file has an lzma signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x5d\00\00", 3);
}